

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O3

Acb_Ntk_t *
Acb_NtkFromNdr(char *pFileName,void *pModule,Abc_Nam_t *pNames,Vec_Int_t *vWeights,int nNameIdMax)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Abc_Nam_t *pAVar5;
  Acb_Man_t *p;
  Acb_Ntk_t *p_00;
  int *__ptr;
  int *piVar6;
  char *pcVar7;
  Abc_Nam_t *pAVar8;
  long lVar9;
  int iVar10;
  Abc_Nam_t *pStrs;
  long lVar11;
  int Counter_1;
  int iVar12;
  Acb_ObjType_t Type;
  byte bVar13;
  int iVar14;
  int iVar15;
  undefined4 in_register_00000084;
  Abc_Nam_t *pMods;
  ulong uVar16;
  long lVar17;
  int *piVar18;
  int Obj_1;
  int iVar19;
  Hash_IntMan_t *in_R9;
  long lVar20;
  int *piVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  void *local_68;
  int local_34;
  
  pMods = (Abc_Nam_t *)CONCAT44(in_register_00000084,nNameIdMax);
  pAVar8 = (Abc_Nam_t *)vWeights;
  pAVar5 = Abc_NamRef(pNames);
  p = Acb_ManAlloc(pFileName,(int)pAVar5,pStrs,pAVar8,pMods,in_R9);
  iVar14 = 0;
  iVar3 = Abc_NamStrFindOrAdd(p->pStrs,p->pName,(int *)0x0);
  lVar25 = *(long *)((long)pModule + 0x10);
  iVar12 = *(int *)(lVar25 + 8) + 2;
  iVar10 = 0;
  iVar15 = 0;
  if (3 < iVar12) {
    lVar9 = *(long *)((long)pModule + 8);
    iVar14 = 3;
    iVar10 = 0;
    do {
      lVar20 = (long)iVar14;
      bVar13 = *(byte *)(lVar9 + lVar20);
      if (bVar13 == 3) {
        for (iVar15 = iVar14 + 1; iVar15 < *(int *)(lVar25 + lVar20 * 4) + iVar14;
            iVar15 = iVar15 + iVar19) {
          lVar17 = (long)iVar15;
          bVar1 = *(byte *)(lVar9 + lVar17);
          if (bVar1 == 6) {
            iVar10 = iVar10 + (uint)(*(int *)(lVar25 + lVar17 * 4) == 3);
            goto LAB_0036b076;
          }
          if (bVar1 == 0) goto LAB_0036b9ea;
          iVar19 = 1;
          if (bVar1 < 4) {
            iVar19 = *(int *)(lVar25 + lVar17 * 4);
          }
        }
        iVar10 = iVar10 + 1;
      }
      else if (bVar13 == 0) goto LAB_0036b9ea;
LAB_0036b076:
      iVar15 = 1;
      if (bVar13 < 4) {
        iVar15 = *(int *)(lVar25 + lVar20 * 4);
      }
      iVar14 = iVar14 + iVar15;
    } while (iVar14 < iVar12);
    iVar15 = 3;
    iVar14 = 0;
    do {
      lVar20 = (long)iVar15;
      bVar13 = *(byte *)(lVar9 + lVar20);
      if (bVar13 == 3) {
        for (iVar19 = iVar15 + 1; iVar19 < *(int *)(lVar25 + lVar20 * 4) + iVar15;
            iVar19 = iVar19 + iVar24) {
          lVar17 = (long)iVar19;
          bVar1 = *(byte *)(lVar9 + lVar17);
          if (bVar1 == 6) {
            iVar14 = iVar14 + (uint)(*(int *)(lVar25 + lVar17 * 4) == 4);
            goto LAB_0036b0fd;
          }
          if (bVar1 == 0) goto LAB_0036b9ea;
          iVar24 = 1;
          if (bVar1 < 4) {
            iVar24 = *(int *)(lVar25 + lVar17 * 4);
          }
        }
        iVar14 = iVar14 + 1;
      }
      else if (bVar13 == 0) goto LAB_0036b9ea;
LAB_0036b0fd:
      iVar19 = 1;
      if (bVar13 < 4) {
        iVar19 = *(int *)(lVar25 + lVar20 * 4);
      }
      iVar15 = iVar15 + iVar19;
    } while (iVar15 < iVar12);
    iVar19 = 3;
    iVar15 = 0;
    do {
      bVar13 = *(byte *)(lVar9 + iVar19);
      if (bVar13 == 0) goto LAB_0036b9ea;
      iVar24 = 1;
      if (bVar13 < 4) {
        iVar24 = *(int *)(lVar25 + (long)iVar19 * 4);
      }
      iVar15 = iVar15 + (uint)(bVar13 == 3);
      iVar19 = iVar19 + iVar24;
    } while (iVar19 < iVar12);
  }
  p_00 = Acb_NtkAlloc(p,iVar3,iVar10,iVar14,iVar15);
  __ptr = (int *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nNameIdMax - 1U) {
    iVar3 = nNameIdMax;
  }
  *__ptr = iVar3;
  if (iVar3 == 0) {
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = nNameIdMax;
LAB_0036b1d0:
    local_68 = (void *)0x0;
  }
  else {
    local_68 = malloc((long)iVar3 << 2);
    *(void **)(__ptr + 2) = local_68;
    __ptr[1] = nNameIdMax;
    if (local_68 == (void *)0x0) goto LAB_0036b1d0;
    memset(local_68,0,(long)nNameIdMax << 2);
  }
  uVar4 = (p_00->vObjType).nCap;
  if ((p_00->vObjWeight).nCap < (int)uVar4) {
    piVar6 = (p_00->vObjWeight).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar4 << 2);
    }
    (p_00->vObjWeight).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0036bdcf;
    (p_00->vObjWeight).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p_00->vObjWeight).pArray,0,(ulong)uVar4 * 4);
  }
  (p_00->vObjWeight).nSize = uVar4;
  uVar4 = (p_00->vObjType).nCap;
  if ((p_00->vObjName).nCap < (int)uVar4) {
    piVar6 = (p_00->vObjName).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar4 << 2);
    }
    (p_00->vObjName).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_0036bdcf:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vObjName).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p_00->vObjName).pArray,0,(ulong)uVar4 * 4);
  }
  (p_00->vObjName).nSize = uVar4;
  lVar25 = *(long *)((long)pModule + 0x10);
  if (3 < *(int *)(lVar25 + 8) + 2) {
    lVar9 = *(long *)((long)pModule + 8);
    iVar3 = 3;
LAB_0036b2c5:
    lVar20 = (long)iVar3;
    bVar13 = *(byte *)(lVar9 + lVar20);
    if (bVar13 != 3) {
      if (bVar13 != 0) goto LAB_0036b41a;
      goto LAB_0036b9ea;
    }
    iVar10 = iVar3 + 1;
    iVar12 = *(int *)(lVar25 + lVar20 * 4) + iVar3;
    iVar14 = iVar10;
    if (iVar10 < iVar12) {
      do {
        lVar17 = (long)iVar14;
        bVar13 = *(byte *)(lVar9 + lVar17);
        if (bVar13 == 6) {
          if (*(int *)(lVar25 + lVar17 * 4) != 3) {
            lVar25 = *(long *)((long)pModule + 0x10);
            goto LAB_0036b436;
          }
          break;
        }
        if (bVar13 == 0) goto LAB_0036b9ea;
        iVar15 = 1;
        if (bVar13 < 4) {
          iVar15 = *(int *)(lVar25 + lVar17 * 4);
        }
        iVar14 = iVar14 + iVar15;
      } while (iVar14 < iVar12);
      do {
        lVar17 = (long)iVar10;
        bVar13 = *(byte *)(lVar9 + lVar17);
        if (bVar13 == 5) goto LAB_0036b360;
        if (bVar13 == 0) goto LAB_0036b9ea;
        iVar14 = 1;
        if (bVar13 < 4) {
          iVar14 = *(int *)(lVar25 + lVar17 * 4);
        }
        iVar10 = iVar10 + iVar14;
        if (iVar12 <= iVar10) break;
      } while( true );
    }
    Acb_ObjAlloc(p_00,ABC_OPER_CI,0,(int)lVar9);
    goto LAB_0036bc90;
  }
  goto LAB_0036bbf0;
LAB_0036b360:
  iVar10 = *(int *)(lVar25 + lVar17 * 4);
  lVar25 = (long)iVar10;
  uVar4 = Acb_ObjAlloc(p_00,ABC_OPER_CI,0,(int)lVar9);
  if ((lVar25 < 0) || (nNameIdMax <= iVar10)) goto LAB_0036bc90;
  *(uint *)((long)local_68 + lVar25 * 4) = uVar4;
  if ((int)uVar4 < 1) goto LAB_0036bcf6;
  uVar2 = (p_00->vObjName).nSize;
  if ((int)uVar2 < 1) goto LAB_0036bcce;
  if (uVar2 <= uVar4) goto LAB_0036bcaf;
  piVar6 = (p_00->vObjName).pArray;
  if (piVar6[uVar4] != 0) goto LAB_0036bcd7;
  piVar6[uVar4] = iVar10;
  if (vWeights == (Vec_Int_t *)0x0) {
    iVar10 = 1;
  }
  else {
    if (vWeights->nSize <= iVar10) goto LAB_0036bcaf;
    iVar10 = vWeights->pArray[lVar25];
  }
  uVar2 = (p_00->vObjWeight).nSize;
  if ((int)uVar2 < 1) goto LAB_0036bd34;
  if (uVar2 <= uVar4) goto LAB_0036bcaf;
  piVar6 = (p_00->vObjWeight).pArray;
  if (piVar6[uVar4] != 0) goto LAB_0036bd15;
  piVar6[uVar4] = iVar10;
  lVar9 = *(long *)((long)pModule + 8);
  bVar13 = *(byte *)(lVar9 + lVar20);
LAB_0036b41a:
  if (bVar13 == 0) goto LAB_0036b9ea;
  lVar25 = *(long *)((long)pModule + 0x10);
  iVar10 = 1;
  if (bVar13 < 4) {
LAB_0036b436:
    iVar10 = *(int *)(lVar25 + lVar20 * 4);
  }
  iVar3 = iVar3 + iVar10;
  iVar10 = *(int *)(lVar25 + 8) + 2;
  if (iVar10 <= iVar3) goto code_r0x0036b44b;
  goto LAB_0036b2c5;
code_r0x0036b44b:
  if (3 < iVar10) {
    lVar9 = *(long *)((long)pModule + 8);
    iVar3 = 3;
    do {
      lVar20 = (long)iVar3;
      bVar13 = *(byte *)(lVar9 + lVar20);
      if (bVar13 == 10) {
        iVar10 = *(int *)(lVar25 + lVar20 * 4);
        uVar4 = Acb_ObjAlloc(p_00,ABC_OPER_CONST_F,0,(int)lVar9);
        if (((long)iVar10 < 0) || (nNameIdMax <= iVar10)) goto LAB_0036bc90;
        *(uint *)((long)local_68 + (long)iVar10 * 4) = uVar4;
        if ((int)uVar4 < 1) goto LAB_0036bcf6;
        uVar2 = (p_00->vObjName).nSize;
        if ((int)uVar2 < 1) goto LAB_0036bcce;
        if (uVar2 <= uVar4) goto LAB_0036bcaf;
        piVar6 = (p_00->vObjName).pArray;
        if (piVar6[uVar4] != 0) goto LAB_0036bcd7;
        piVar6[uVar4] = iVar10;
        Vec_IntPush(&p_00->vTargets,uVar4);
        lVar9 = *(long *)((long)pModule + 8);
        bVar13 = *(byte *)(lVar9 + lVar20);
      }
      else if (bVar13 == 0) goto LAB_0036b9ea;
      if (bVar13 == 0) goto LAB_0036b9ea;
      lVar25 = *(long *)((long)pModule + 0x10);
      iVar10 = 1;
      if (bVar13 < 4) {
        iVar10 = *(int *)(lVar25 + lVar20 * 4);
      }
      iVar3 = iVar3 + iVar10;
      iVar10 = *(int *)(lVar25 + 8) + 2;
    } while (iVar3 < iVar10);
    if (3 < iVar10) {
      lVar9 = *(long *)((long)pModule + 8);
      iVar3 = 3;
LAB_0036b52e:
      lVar20 = (long)iVar3;
      bVar13 = *(byte *)(lVar9 + lVar20);
      if (bVar13 == 3) {
        iVar12 = *(int *)(lVar25 + lVar20 * 4) + iVar3;
        iVar14 = iVar3 + 1;
        for (iVar10 = iVar14; iVar10 < iVar12; iVar10 = iVar10 + iVar15) {
          lVar17 = (long)iVar10;
          bVar13 = *(byte *)(lVar9 + lVar17);
          if (bVar13 == 6) {
            iVar10 = iVar14;
            if (*(int *)(lVar25 + lVar17 * 4) != 3) goto LAB_0036b5aa;
            break;
          }
          if (bVar13 == 0) goto LAB_0036b9ea;
          iVar15 = 1;
          if (bVar13 < 4) {
            iVar15 = *(int *)(lVar25 + lVar17 * 4);
          }
        }
        goto LAB_0036b5e1;
      }
      if (bVar13 != 0) goto LAB_0036b542;
      goto LAB_0036b9ea;
    }
  }
  goto LAB_0036bbf0;
  while( true ) {
    if (bVar13 == 0) goto LAB_0036b9ea;
    iVar15 = 1;
    if (bVar13 < 4) {
      iVar15 = *(int *)(lVar25 + lVar17 * 4);
    }
    iVar10 = iVar10 + iVar15;
    if (iVar12 <= iVar10) break;
LAB_0036b5aa:
    lVar17 = (long)iVar10;
    bVar13 = *(byte *)(lVar9 + lVar17);
    if (bVar13 == 6) {
      iVar10 = iVar14;
      if (*(int *)(lVar25 + lVar17 * 4) != 4) goto LAB_0036b601;
      break;
    }
  }
LAB_0036b5e1:
  lVar25 = *(long *)((long)pModule + 0x10);
  goto LAB_0036b5e5;
  while( true ) {
    if (bVar13 == 0) goto LAB_0036b9ea;
    iVar15 = 1;
    if (bVar13 < 4) {
      iVar15 = *(int *)(lVar25 + lVar17 * 4);
    }
    iVar10 = iVar10 + iVar15;
    if (iVar12 <= iVar10) break;
LAB_0036b601:
    lVar17 = (long)iVar10;
    bVar13 = *(byte *)(lVar9 + lVar17);
    if (bVar13 == 5) {
      uVar26 = (ulong)*(uint *)(lVar25 + lVar17 * 4);
      goto LAB_0036b63b;
    }
  }
  uVar26 = 0xffffffff;
LAB_0036b63b:
  lVar17 = 0;
  lVar22 = 0;
  iVar15 = 0;
  iVar10 = iVar14;
  do {
    lVar23 = (long)iVar10;
    bVar13 = *(byte *)(lVar9 + lVar23);
    if (bVar13 == 4) {
      iVar15 = iVar15 + 1;
      lVar23 = lVar25 + lVar23 * 4;
      if (lVar22 == 0) {
        lVar22 = lVar23;
        lVar17 = lVar23;
      }
      iVar19 = 1;
    }
    else {
      if (bVar13 == 0) goto LAB_0036b9ea;
      if (lVar17 != 0) break;
      if (bVar13 == 0) goto LAB_0036b9ea;
      if (bVar13 < 4) {
        iVar19 = *(int *)(lVar25 + lVar23 * 4);
      }
      else {
        iVar19 = 1;
      }
      lVar17 = 0;
      lVar22 = 0;
    }
    iVar10 = iVar10 + iVar19;
  } while (iVar10 < iVar12);
  do {
    lVar17 = (long)iVar14;
    bVar13 = *(byte *)(lVar9 + lVar17);
    if (bVar13 == 6) {
      Type = *(Acb_ObjType_t *)(lVar25 + lVar17 * 4);
      goto LAB_0036b6d9;
    }
    if (bVar13 == 0) goto LAB_0036b9ea;
    iVar10 = 1;
    if (bVar13 < 4) {
      iVar10 = *(int *)(lVar25 + lVar17 * 4);
    }
    iVar14 = iVar14 + iVar10;
  } while (iVar14 < iVar12);
  Type = ~ABC_OPER_NONE;
LAB_0036b6d9:
  uVar4 = Acb_ObjAlloc(p_00,Type,iVar15,(int)lVar9);
  iVar10 = (int)uVar26;
  if ((iVar10 < 0) || (nNameIdMax <= iVar10)) {
LAB_0036bc90:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(uint *)((long)local_68 + uVar26 * 4) = uVar4;
  if ((int)uVar4 < 1) goto LAB_0036bcf6;
  uVar2 = (p_00->vObjName).nSize;
  if ((int)uVar2 < 1) goto LAB_0036bcce;
  if (uVar2 <= uVar4) goto LAB_0036bcaf;
  piVar6 = (p_00->vObjName).pArray;
  if (piVar6[uVar4] != 0) goto LAB_0036bcd7;
  piVar6[uVar4] = iVar10;
  lVar9 = *(long *)((long)pModule + 8);
  bVar13 = *(byte *)(lVar9 + lVar20);
LAB_0036b542:
  if (bVar13 == 0) goto LAB_0036b9ea;
  lVar25 = *(long *)((long)pModule + 0x10);
  iVar10 = 1;
  if (3 < bVar13) goto LAB_0036b5e8;
LAB_0036b5e5:
  iVar10 = *(int *)(lVar25 + lVar20 * 4);
LAB_0036b5e8:
  iVar3 = iVar3 + iVar10;
  iVar10 = *(int *)(lVar25 + 8) + 2;
  if (iVar10 <= iVar3) goto LAB_0036b741;
  goto LAB_0036b52e;
LAB_0036bcf6:
  pcVar7 = "i>0";
  goto LAB_0036bcfd;
LAB_0036b741:
  if (3 < iVar10) {
    lVar9 = *(long *)((long)pModule + 8);
    iVar3 = 3;
LAB_0036b753:
    lVar20 = (long)iVar3;
    bVar13 = *(byte *)(lVar9 + lVar20);
    if (bVar13 == 3) {
      iVar12 = *(int *)(lVar25 + lVar20 * 4) + iVar3;
      iVar10 = iVar3 + 1;
      for (iVar14 = iVar10; iVar14 < iVar12; iVar14 = iVar14 + iVar15) {
        lVar17 = (long)iVar14;
        bVar13 = *(byte *)(lVar9 + lVar17);
        if (bVar13 == 6) {
          iVar14 = iVar10;
          if (*(int *)(lVar25 + lVar17 * 4) != 3) goto LAB_0036b7c8;
          break;
        }
        if (bVar13 == 0) goto LAB_0036b9ea;
        iVar15 = 1;
        if (bVar13 < 4) {
          iVar15 = *(int *)(lVar25 + lVar17 * 4);
        }
      }
      goto LAB_0036b7ff;
    }
    if (bVar13 != 0) goto LAB_0036b767;
    goto LAB_0036b9ea;
  }
  goto LAB_0036bbf0;
  while( true ) {
    if (bVar13 == 0) goto LAB_0036b9ea;
    iVar15 = 1;
    if (bVar13 < 4) {
      iVar15 = *(int *)(lVar25 + lVar17 * 4);
    }
    iVar14 = iVar14 + iVar15;
    if (iVar12 <= iVar14) break;
LAB_0036b7c8:
    lVar17 = (long)iVar14;
    bVar13 = *(byte *)(lVar9 + lVar17);
    if (bVar13 == 6) {
      iVar14 = iVar10;
      if (*(int *)(lVar25 + lVar17 * 4) != 4) goto LAB_0036b81c;
      break;
    }
  }
  goto LAB_0036b7ff;
LAB_0036b81c:
  lVar17 = (long)iVar14;
  bVar13 = *(byte *)(lVar9 + lVar17);
  if (bVar13 == 5) goto LAB_0036b84f;
  if (bVar13 == 0) goto LAB_0036b9ea;
  iVar15 = 1;
  if (bVar13 < 4) {
    iVar15 = *(int *)(lVar25 + lVar17 * 4);
  }
  iVar14 = iVar14 + iVar15;
  if (iVar12 <= iVar14) goto LAB_0036bcaf;
  goto LAB_0036b81c;
LAB_0036b84f:
  iVar14 = *(int *)(lVar25 + lVar17 * 4);
  lVar17 = (long)iVar14;
  if ((lVar17 < 0) || (nNameIdMax <= iVar14)) goto LAB_0036bcaf;
  uVar4 = *(uint *)((long)local_68 + lVar17 * 4);
  lVar22 = 0;
  lVar23 = 0;
  lVar27 = 0;
  uVar26 = 0;
  do {
    lVar11 = (long)iVar10;
    bVar13 = *(byte *)(lVar9 + lVar11);
    if (bVar13 == 4) {
      uVar26 = (ulong)((int)uVar26 + 1);
      iVar15 = 1;
      if (lVar27 == 0) {
        lVar22 = lVar25 + lVar11 * 4;
        lVar23 = lVar22;
        lVar27 = lVar22;
      }
    }
    else {
      if (bVar13 == 0) goto LAB_0036b9ea;
      if (lVar23 != 0) break;
      if (bVar13 == 0) goto LAB_0036b9ea;
      if (bVar13 < 4) {
        iVar15 = *(int *)(lVar25 + lVar11 * 4);
      }
      else {
        iVar15 = 1;
      }
      lVar23 = 0;
      lVar27 = 0;
    }
    iVar10 = iVar10 + iVar15;
  } while (iVar10 < iVar12);
  if (0 < (int)uVar26) {
    uVar16 = 0;
    do {
      iVar10 = *(int *)(lVar22 + uVar16 * 4);
      if (((long)iVar10 < 0) || (nNameIdMax <= iVar10)) goto LAB_0036bcaf;
      if ((int)uVar4 < 1) goto LAB_0036bd72;
      if ((p_00->vObjFans).nSize <= (int)uVar4) goto LAB_0036bcaf;
      iVar12 = (p_00->vObjFans).pArray[uVar4];
      if (((long)iVar12 < 0) || ((p_00->vFanSto).nSize <= iVar12)) goto LAB_0036bd53;
      iVar10 = *(int *)((long)local_68 + (long)iVar10 * 4);
      if (iVar10 < 1) goto LAB_0036bdb0;
      piVar6 = (p_00->vFanSto).pArray + iVar12;
      iVar12 = *piVar6;
      if (piVar6[(long)iVar12 + 1] != -1) goto LAB_0036bd91;
      *piVar6 = iVar12 + 1;
      piVar6[(long)iVar12 + 1] = iVar10;
      uVar16 = uVar16 + 1;
    } while (uVar26 != uVar16);
  }
  if (vWeights == (Vec_Int_t *)0x0) {
    iVar10 = 1;
  }
  else {
    if (vWeights->nSize <= iVar14) goto LAB_0036bcaf;
    iVar10 = vWeights->pArray[lVar17];
  }
  if ((int)uVar4 < 1) {
    pcVar7 = "i>0";
    goto LAB_0036bd3b;
  }
  uVar2 = (p_00->vObjWeight).nSize;
  if ((int)uVar2 < 1) goto LAB_0036bd34;
  if (uVar2 <= uVar4) goto LAB_0036bcaf;
  piVar6 = (p_00->vObjWeight).pArray;
  if (piVar6[uVar4] != 0) {
LAB_0036bd15:
    __assert_fail("Acb_ObjWeight(p, i)== 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x11c,"void Acb_ObjSetWeight(Acb_Ntk_t *, int, int)");
  }
  piVar6[uVar4] = iVar10;
  bVar13 = *(byte *)(lVar9 + lVar20);
  if (bVar13 == 0) goto LAB_0036b9ea;
LAB_0036b767:
  iVar10 = 1;
  if (3 < bVar13) goto LAB_0036b803;
LAB_0036b7ff:
  iVar10 = *(int *)(lVar25 + lVar20 * 4);
LAB_0036b803:
  iVar3 = iVar3 + iVar10;
  iVar10 = *(int *)(lVar25 + 8) + 2;
  if (iVar10 <= iVar3) goto LAB_0036ba09;
  goto LAB_0036b753;
LAB_0036bd34:
  pcVar7 = "Acb_NtkHasObjWeights(p)";
LAB_0036bd3b:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
LAB_0036bcce:
  pcVar7 = "Acb_NtkHasObjNames(p)";
LAB_0036bcfd:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
LAB_0036ba09:
  if (3 < iVar10) {
    lVar9 = *(long *)((long)pModule + 8);
    iVar3 = 3;
    do {
      lVar20 = (long)iVar3;
      bVar13 = *(byte *)(lVar9 + lVar20);
      if (bVar13 == 3) {
        iVar10 = iVar3 + 1;
        iVar12 = *(int *)(lVar25 + lVar20 * 4) + iVar3;
        iVar14 = iVar10;
        if (iVar12 <= iVar10) {
LAB_0036bdee:
          __assert_fail("nArray == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbAbc.c"
                        ,0xd5,
                        "Acb_Ntk_t *Acb_NtkFromNdr(char *, void *, Abc_Nam_t *, Vec_Int_t *, int)");
        }
        do {
          lVar17 = (long)iVar14;
          bVar13 = *(byte *)(lVar9 + lVar17);
          if (bVar13 == 6) {
            if (*(int *)(lVar25 + lVar17 * 4) != 4) {
              lVar25 = *(long *)((long)pModule + 0x10);
              goto LAB_0036bbda;
            }
            break;
          }
          if (bVar13 == 0) goto LAB_0036b9ea;
          iVar15 = 1;
          if (bVar13 < 4) {
            iVar15 = *(int *)(lVar25 + lVar17 * 4);
          }
          iVar14 = iVar14 + iVar15;
        } while (iVar14 < iVar12);
        piVar6 = (int *)0x0;
        piVar18 = (int *)0x0;
        piVar21 = (int *)0x0;
        iVar14 = 0;
        do {
          lVar17 = (long)iVar10;
          bVar13 = *(byte *)(lVar9 + lVar17);
          if (bVar13 == 4) {
            iVar14 = iVar14 + 1;
            iVar15 = 1;
            if (piVar21 == (int *)0x0) {
              piVar6 = (int *)(lVar25 + lVar17 * 4);
              piVar18 = piVar6;
              piVar21 = piVar6;
            }
          }
          else {
            if (bVar13 == 0) goto LAB_0036b9ea;
            if (piVar18 != (int *)0x0) break;
            if (bVar13 == 0) goto LAB_0036b9ea;
            if (bVar13 < 4) {
              iVar15 = *(int *)(lVar25 + lVar17 * 4);
            }
            else {
              iVar15 = 1;
            }
            piVar18 = (int *)0x0;
            piVar21 = (int *)0x0;
          }
          iVar10 = iVar10 + iVar15;
        } while (iVar10 < iVar12);
        if (iVar14 != 1) goto LAB_0036bdee;
        uVar4 = Acb_ObjAlloc(p_00,ABC_OPER_CO,1,(int)lVar9);
        iVar10 = *piVar6;
        if (((long)iVar10 < 0) || (__ptr[1] <= iVar10)) {
LAB_0036bcaf:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((int)uVar4 < 1) {
LAB_0036bd72:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
        }
        if ((p_00->vObjFans).nSize <= (int)uVar4) goto LAB_0036bcaf;
        iVar14 = (p_00->vObjFans).pArray[uVar4];
        if (((long)iVar14 < 0) || ((p_00->vFanSto).nSize <= iVar14)) {
LAB_0036bd53:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar10 = *(int *)((long)local_68 + (long)iVar10 * 4);
        if (iVar10 < 1) {
LAB_0036bdb0:
          __assert_fail("iFanin > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
        }
        piVar18 = (p_00->vFanSto).pArray + iVar14;
        iVar14 = *piVar18;
        if (piVar18[(long)iVar14 + 1] != -1) {
LAB_0036bd91:
          __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
        }
        *piVar18 = iVar14 + 1;
        piVar18[(long)iVar14 + 1] = iVar10;
        uVar2 = (p_00->vObjName).nSize;
        if ((int)uVar2 < 1) goto LAB_0036bcce;
        if (uVar2 <= uVar4) goto LAB_0036bcaf;
        piVar18 = (p_00->vObjName).pArray;
        if (piVar18[uVar4] != 0) {
LAB_0036bcd7:
          __assert_fail("Acb_ObjName(p, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0x11e,"void Acb_ObjSetName(Acb_Ntk_t *, int, int)");
        }
        piVar18[uVar4] = *piVar6;
        lVar9 = *(long *)((long)pModule + 8);
        bVar13 = *(byte *)(lVar9 + lVar20);
      }
      else if (bVar13 == 0) {
LAB_0036b9ea:
        __assert_fail("p->pHead[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                      ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
      }
      if (bVar13 == 0) goto LAB_0036b9ea;
      lVar25 = *(long *)((long)pModule + 0x10);
      iVar10 = 1;
      if (bVar13 < 4) {
LAB_0036bbda:
        iVar10 = *(int *)(lVar25 + lVar20 * 4);
      }
      iVar3 = iVar3 + iVar10;
    } while (iVar3 < *(int *)(lVar25 + 8) + 2);
  }
LAB_0036bbf0:
  if (local_68 != (void *)0x0) {
    free(local_68);
  }
  free(__ptr);
  p_00->nRegs = 0;
  pAVar8 = p->pMods;
  pcVar7 = Abc_NamStr(p_00->pDesign->pStrs,p_00->NameId);
  iVar3 = Abc_NamStrFindOrAdd(pAVar8,pcVar7,&local_34);
  if (local_34 == 0) {
    if (iVar3 != p_00->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0x2a0,"void Acb_NtkAdd(Acb_Man_t *, Acb_Ntk_t *)");
    }
  }
  else {
    pcVar7 = Abc_NamStr(p_00->pDesign->pStrs,p_00->NameId);
    printf("Network with name \"%s\" already exists.\n",pcVar7);
  }
  return p_00;
}

Assistant:

Acb_Ntk_t * Acb_NtkFromNdr( char * pFileName, void * pModule, Abc_Nam_t * pNames, Vec_Int_t * vWeights, int nNameIdMax )
{
    Ndr_Data_t * p   = (Ndr_Data_t *)pModule; 
    Acb_Man_t * pMan = Acb_ManAlloc( pFileName, 1, Abc_NamRef(pNames), NULL, NULL, NULL );
    int k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, pMan->pName, NULL );
    int Mod = 2, Obj, Type, nArray, * pArray, ObjId;
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Ndr_DataCiNum(p, Mod), Ndr_DataCoNum(p, Mod), Ndr_DataObjNum(p, Mod) );
    Vec_Int_t * vMap = Vec_IntStart( nNameIdMax );
    Acb_NtkCleanObjWeights( pNtk );
    Acb_NtkCleanObjNames( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachTarget( p, Mod, Obj )
    {
        NameId = Ndr_DataEntry( p, Obj );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CONST_F, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Vec_IntPush( &pNtk->vTargets, ObjId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Type   = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        ObjId  = Acb_ObjAlloc( pNtk, (Acb_ObjType_t) Type, nArray, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        //char * pName;
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        //pName = Abc_NamStr( pMan->pStrs, NameId );
        ObjId  = Vec_IntEntry( vMap, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( k = 0; k < nArray; k++ )
            Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[k]) );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        assert( nArray == 1 );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[0]) );
        Acb_ObjSetName( pNtk, ObjId, pArray[0] );
    }
    Vec_IntFree( vMap );
    Acb_NtkSetRegNum( pNtk, 0 );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}